

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

void __thiscall
Saturation::SaturationAlgorithm::addInputSOSClause(SaturationAlgorithm *this,Clause *cl)

{
  ImmediateSimplificationEngine *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  LiteralSelector *this_00;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  Clause *simplCl;
  Clause *local_30;
  
  cl->_refCnt = cl->_refCnt + 1;
  onNewClause(this,cl);
  do {
    pIVar1 = (this->_immediateSimplifier)._obj;
    iVar3 = (*(pIVar1->super_InferenceEngine)._vptr_InferenceEngine[6])(pIVar1,cl);
    local_30 = (Clause *)CONCAT44(extraout_var,iVar3);
    if (local_30 == cl) {
      if ((*(uint *)&cl->field_0x38 & 0xfffff) == 0) {
        addNewClause(this,cl);
      }
      else {
        this_00 = getSosLiteralSelector(this);
        Kernel::LiteralSelector::select(this_00,(int)cl,(fd_set *)0x0,in_RCX,in_R8,in_R9);
        Kernel::Clause::setStore(cl,ACTIVE);
        *(int *)(DAT_00b7e1c0 + 0x1dc) = *(int *)(DAT_00b7e1c0 + 0x1dc) + 1;
        (*(this->_active->super_RandomAccessClauseContainer).super_ClauseContainer.
          _vptr_ClauseContainer[2])(this->_active,cl);
        (*(this->super_MainLoop)._vptr_MainLoop[7])(this,cl);
      }
LAB_0068d76d:
      cl->_refCnt = cl->_refCnt - 1;
      Kernel::Clause::destroyIfUnnecessary(cl);
      bVar2 = true;
    }
    else {
      if (local_30 == (Clause *)0x0) {
        in_RCX = (fd_set *)0x0;
        in_R8 = (fd_set *)0x0;
        in_R9 = (timeval *)0x1;
        onClauseReduction(this,cl,(Clause **)0x0,0,(Clause *)0x0,true);
        goto LAB_0068d76d;
      }
      local_30->_refCnt = local_30->_refCnt + 1;
      cl->_refCnt = cl->_refCnt - 1;
      Kernel::Clause::destroyIfUnnecessary(cl);
      onNewClause(this,local_30);
      bVar2 = false;
      in_RCX = (fd_set *)0x1;
      in_R8 = (fd_set *)0x0;
      in_R9 = (timeval *)0x1;
      onClauseReduction(this,cl,&local_30,1,(Clause *)0x0,true);
      cl = local_30;
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void SaturationAlgorithm::addInputSOSClause(Clause* cl)
{
  ASS_EQ(toNumber(cl->inputType()),toNumber(UnitInputType::AXIOM));

  // we add an extra reference until the clause is added to some container, so that
  // it won't get deleted during some code e.g. in the onNewClause handler
  cl->incRefCnt();

  onNewClause(cl);

simpl_start:

  Clause *simplCl = _immediateSimplifier->simplify(cl);
  if (simplCl != cl) {
    if (!simplCl) {
      onClauseReduction(cl, 0, 0, 0);
      goto fin;
    }

    simplCl->incRefCnt();
    cl->decRefCnt(); // now cl is referenced from simplCl, so after removing the extra reference, it won't be destroyed

    onNewClause(simplCl);
    onClauseReduction(cl, &simplCl, 1, 0);
    cl = simplCl;
    goto simpl_start;
  }

  if (cl->isEmpty()) {
    addNewClause(cl);
    goto fin;
  }

  ASS(!cl->numSelected());
  {
    LiteralSelector& sosSelector = getSosLiteralSelector();
    sosSelector.select(cl);
  }

  cl->setStore(Clause::ACTIVE);
  env.statistics->activeClauses++;
  _active->add(cl);

  onSOSClauseAdded(cl);

fin:
  cl->decRefCnt();
}